

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkCountRealPis(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  int i;
  int iVar2;
  
  Wlc_NtkMarkCone(p,-1,-1,1,0);
  iVar2 = 0;
  for (i = 0; i < (p->vPis).nSize; i = i + 1) {
    pWVar1 = Wlc_NtkPi(p,i);
    iVar2 = iVar2 + (uint)((*(uint *)pWVar1 >> 7 & 1) != 0);
  }
  Wlc_NtkCleanMarks(p);
  return iVar2;
}

Assistant:

int Wlc_NtkCountRealPis( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, Count = 0;
    Wlc_NtkMarkCone( p, -1, -1, 1, 0 );
    Wlc_NtkForEachPi( p, pObj, i )
        Count += pObj->Mark;
    Wlc_NtkCleanMarks( p );
    return Count;
}